

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
makePointer(wasm::Expression*,wasm::Address_(void *this,Expression *ptr,Address offset)

{
  size_t sVar1;
  Ref this_00;
  Ref RVar2;
  Ref RVar3;
  Ref in_R8;
  undefined1 auVar4 [16];
  IString nextResult;
  IString op;
  
  nextResult.str._M_str = DAT_00e645f0;
  nextResult.str._M_len = EXPRESSION_RESULT;
  this_00 = visit(wasm::Expression*,wasm::IString_(this,ptr,nextResult);
  sVar1 = DAT_00e649a0;
  RVar3.inst = cashew::PLUS.inst;
  if (offset.addr != 0) {
    auVar4._8_4_ = (int)(offset.addr >> 0x20);
    auVar4._0_8_ = offset.addr;
    auVar4._12_4_ = 0x45300000;
    RVar2 = cashew::ValueBuilder::makeDouble
                      ((auVar4._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)offset.addr) - 4503599627370496.0));
    op.str._M_str = (char *)RVar2.inst;
    op.str._M_len = sVar1;
    RVar3 = cashew::ValueBuilder::makeBinary(this_00.inst,RVar3,op,in_R8);
    RVar3 = makeJsCoercion(RVar3,JS_INT);
    return (Ref)RVar3.inst;
  }
  return (Ref)this_00.inst;
}

Assistant:

Ref makePointer(Expression* ptr, Address offset) {
      auto ret = visit(ptr, EXPRESSION_RESULT);
      if (offset) {
        ret = makeJsCoercion(
          ValueBuilder::makeBinary(ret, PLUS, ValueBuilder::makeNum(offset)),
          JS_INT);
      }
      return ret;
    }